

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O3

BlobInfo * __thiscall
Blob_Detection::BlobDetection::getBestBlob(BlobDetection *this,BlobCriterion criterion)

{
  pointer puVar1;
  BlobInfo *pBVar2;
  BlobInfo *pBVar3;
  imageException *this_00;
  BlobInfo *pBVar4;
  BlobInfo *pBVar5;
  pointer puVar6;
  
  switch(criterion) {
  case CRITERION_CIRCULARITY:
    pBVar3 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar5 = pBVar3 + 1;
    pBVar4 = pBVar3;
    if (pBVar5 != pBVar2 && pBVar3 != pBVar2) {
      do {
        pBVar3 = pBVar5;
        if ((pBVar5->_circularity).value <= (pBVar4->_circularity).value) {
          pBVar3 = pBVar4;
        }
        pBVar5 = pBVar5 + 1;
        pBVar4 = pBVar3;
      } while (pBVar5 != pBVar2);
    }
    break;
  case CRITERION_ELONGATION:
    pBVar3 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar5 = pBVar3 + 1;
    pBVar4 = pBVar3;
    if (pBVar5 != pBVar2 && pBVar3 != pBVar2) {
      do {
        pBVar3 = pBVar5;
        if ((pBVar5->_elongation).value <= (pBVar4->_elongation).value) {
          pBVar3 = pBVar4;
        }
        pBVar5 = pBVar5 + 1;
        pBVar4 = pBVar3;
      } while (pBVar5 != pBVar2);
    }
    break;
  case CRITERION_HEIGHT:
    pBVar3 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar5 = pBVar3 + 1;
    pBVar4 = pBVar3;
    if (pBVar5 != pBVar2 && pBVar3 != pBVar2) {
      do {
        pBVar3 = pBVar5;
        if ((pBVar5->_height).value <= (pBVar4->_height).value) {
          pBVar3 = pBVar4;
        }
        pBVar5 = pBVar5 + 1;
        pBVar4 = pBVar3;
      } while (pBVar5 != pBVar2);
    }
    break;
  case CRITERION_LENGTH:
    pBVar3 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar5 = pBVar3 + 1;
    pBVar4 = pBVar3;
    if (pBVar5 != pBVar2 && pBVar3 != pBVar2) {
      do {
        pBVar3 = pBVar5;
        if ((pBVar5->_length).value <= (pBVar4->_length).value) {
          pBVar3 = pBVar4;
        }
        pBVar5 = pBVar5 + 1;
        pBVar4 = pBVar3;
      } while (pBVar5 != pBVar2);
    }
    break;
  case CRITERION_SIZE:
    pBVar3 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar4 = pBVar3 + 1;
    if (pBVar4 != pBVar2 && pBVar3 != pBVar2) {
      puVar6 = (pBVar3->_pointX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pBVar5 = pBVar3;
      do {
        puVar1 = (pBVar4->_pointX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pBVar3 = pBVar4;
        if ((ulong)((long)(pBVar4->_pointX).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar1) <=
            (ulong)((long)(pBVar5->_pointX).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar6)) {
          pBVar3 = pBVar5;
          puVar1 = puVar6;
        }
        puVar6 = puVar1;
        pBVar4 = pBVar4 + 1;
        pBVar5 = pBVar3;
      } while (pBVar4 != pBVar2);
    }
    break;
  case CRITERION_WIDTH:
    pBVar3 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar5 = pBVar3 + 1;
    pBVar4 = pBVar3;
    if (pBVar5 != pBVar2 && pBVar3 != pBVar2) {
      do {
        pBVar3 = pBVar5;
        if ((pBVar5->_width).value <= (pBVar4->_width).value) {
          pBVar3 = pBVar4;
        }
        pBVar5 = pBVar5 + 1;
        pBVar4 = pBVar3;
      } while (pBVar5 != pBVar2);
    }
    break;
  default:
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Bad criterion for blob finding");
    __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
  }
  return pBVar3;
}

Assistant:

const BlobInfo & BlobDetection::getBestBlob( BlobCriterion criterion ) const
    {
        switch( criterion ) {
            case CRITERION_CIRCULARITY:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.circularity() < blob2.circularity(); } ));
            case CRITERION_ELONGATION:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.elongation() < blob2.elongation(); } ));
            case CRITERION_HEIGHT:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.height() < blob2.height(); } ));
            case CRITERION_LENGTH:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.length() < blob2.length(); } ));
            case CRITERION_SIZE:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.size() < blob2.size(); } ));
            case CRITERION_WIDTH:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.width() < blob2.width(); } ));
            default:
                throw imageException( "Bad criterion for blob finding" );
        }
    }